

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O0

void VerifyECDSASig(API api,uint8_t *digest,size_t digest_len,ECDSA_SIG *ecdsa_sig,EC_KEY *eckey,
                   int expected_result)

{
  bool bVar1;
  char *pcVar2;
  Message *message;
  undefined4 in_register_0000008c;
  AssertHelper local_110;
  Message local_108;
  AssertHelper local_100;
  Message local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  UniquePtr<uint8_t> delete_der;
  string local_a0;
  AssertHelper local_80 [3];
  Message local_68;
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  size_t der_len;
  uint8_t *der;
  EC_KEY *pEStack_30;
  int expected_result_local;
  EC_KEY *eckey_local;
  ECDSA_SIG *ecdsa_sig_local;
  size_t digest_len_local;
  uint8_t *digest_local;
  API api_local;
  
  pcVar2 = (char *)CONCAT44(in_register_0000008c,expected_result);
  der._4_4_ = expected_result;
  pEStack_30 = eckey;
  eckey_local = (EC_KEY *)ecdsa_sig;
  ecdsa_sig_local = (ECDSA_SIG *)digest_len;
  digest_len_local = (size_t)digest;
  digest_local._4_4_ = api;
  if (api == kEncodedAPI) {
    local_5c = ECDSA_SIG_to_bytes((uint8_t **)&der_len,(size_t *)&gtest_ar_.message_,ecdsa_sig);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_58,&local_5c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
    if (!bVar1) {
      testing::Message::Message(&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,(internal *)local_58,
                 (AssertionResult *)"ECDSA_SIG_to_bytes(&der, &der_len, ecdsa_sig)","false","true",
                 pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x57,pcVar2);
      testing::internal::AssertHelper::operator=(local_80,&local_68);
      testing::internal::AssertHelper::~AssertHelper(local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      testing::Message::~Message(&local_68);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
    if (bVar1) {
      std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar.message_,
                 (pointer)der_len);
      local_c4 = ECDSA_verify(0,(uchar *)digest_len_local,(int)ecdsa_sig_local,(uchar *)der_len,
                              (int)gtest_ar_.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl,(EC_KEY *)pEStack_30);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_c0,"expected_result",
                 "ECDSA_verify(0, digest, digest_len, der, der_len, eckey)",(int *)((long)&der + 4),
                 &local_c4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
      if (!bVar1) {
        testing::Message::Message(&local_d0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                   ,0x5a,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar.message_);
    }
  }
  else if (api == kRawAPI) {
    local_ec = ECDSA_do_verify(digest,(int)digest_len,(ECDSA_SIG *)ecdsa_sig,(EC_KEY *)eckey);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_e8,"expected_result",
               "ECDSA_do_verify(digest, digest_len, ecdsa_sig, eckey)",(int *)((long)&der + 4),
               &local_ec);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x60,pcVar2);
      testing::internal::AssertHelper::operator=(&local_100,&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      testing::Message::~Message(&local_f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  }
  else {
    testing::Message::Message(&local_108);
    message = testing::Message::operator<<(&local_108,(char (*) [18])"Unknown API type.");
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,100,"Failed");
    testing::internal::AssertHelper::operator=(&local_110,message);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  return;
}

Assistant:

static void VerifyECDSASig(API api, const uint8_t *digest, size_t digest_len,
                           const ECDSA_SIG *ecdsa_sig, EC_KEY *eckey,
                           int expected_result) {
  switch (api) {
    case kEncodedAPI: {
      uint8_t *der;
      size_t der_len;
      ASSERT_TRUE(ECDSA_SIG_to_bytes(&der, &der_len, ecdsa_sig));
      bssl::UniquePtr<uint8_t> delete_der(der);
      EXPECT_EQ(expected_result,
                ECDSA_verify(0, digest, digest_len, der, der_len, eckey));
      break;
    }

    case kRawAPI:
      EXPECT_EQ(expected_result,
                ECDSA_do_verify(digest, digest_len, ecdsa_sig, eckey));
      break;

    default:
      FAIL() << "Unknown API type.";
  }
}